

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Group * metaf::GroupParser::reparseAlternative<11ul>
                  (string *group,ReportPart reportPart,ReportMetadata *reportMetadata,
                  size_t ignoreIndex)

{
  bool bVar1;
  Group *in_RDI;
  long in_R8;
  size_t in_stack_00000008;
  ReportMetadata *in_stack_00000010;
  optional<metaf::SeaSurfaceGroup> parsed;
  ReportMetadata *in_stack_00000090;
  ReportPart in_stack_0000009c;
  string *in_stack_000000a0;
  SeaSurfaceGroup *in_stack_ffffffffffffffa8;
  Group *this;
  
  if (in_R8 != 0xb) {
    this = in_RDI;
    SeaSurfaceGroup::parse(in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
    bVar1 = std::optional<metaf::SeaSurfaceGroup>::has_value
                      ((optional<metaf::SeaSurfaceGroup> *)0x25becf);
    if (bVar1) {
      std::optional<metaf::SeaSurfaceGroup>::operator*((optional<metaf::SeaSurfaceGroup> *)0x25bedf)
      ;
      std::
      variant<metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
      ::variant<metaf::SeaSurfaceGroup_const&,void,void,metaf::SeaSurfaceGroup,void>
                (this,in_stack_ffffffffffffffa8);
      return in_RDI;
    }
  }
  reparseAlternative<12ul>
            ((string *)
             parsed.super__Optional_base<metaf::SeaSurfaceGroup,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::SeaSurfaceGroup>._M_payload._4_8_,
             (ReportPart)
             parsed.super__Optional_base<metaf::SeaSurfaceGroup,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::SeaSurfaceGroup>._M_payload._M_value.t.tempValue.
             super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
             _M_payload,in_stack_00000010,in_stack_00000008);
  return in_RDI;
}

Assistant:

static Group reparseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata,
		size_t ignoreIndex)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			if (I != ignoreIndex) {
				const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
				if (parsed.has_value()) return *parsed;
			}
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return reparseAlternative<I+1>(group, reportPart, reportMetadata, ignoreIndex);
		}
	}